

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O1

Vec_Str_t * Lms_GiaSuppSizes(Gia_Man_t *p)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  uint *__ptr;
  void *pvVar4;
  ulong uVar5;
  Vec_Str_t *pVVar6;
  char *pcVar7;
  Vec_Int_t *pVVar8;
  int iVar9;
  uint uVar10;
  char cVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  size_t sVar15;
  long lVar16;
  
  uVar12 = p->nObjs;
  __ptr = (uint *)malloc(0x10);
  uVar10 = 0x10;
  if (0xe < uVar12 - 1) {
    uVar10 = uVar12;
  }
  __ptr[1] = 0;
  *__ptr = uVar10;
  if (uVar10 == 0) {
    pvVar4 = (void *)0x0;
  }
  else {
    pvVar4 = malloc((long)(int)uVar10);
  }
  *(void **)(__ptr + 2) = pvVar4;
  if (uVar10 == 0) {
    if (pvVar4 == (void *)0x0) {
      pvVar4 = malloc(0x10);
    }
    else {
      pvVar4 = realloc(pvVar4,0x10);
    }
    *(void **)(__ptr + 2) = pvVar4;
    *__ptr = 0x10;
  }
  __ptr[1] = 1;
  **(undefined1 **)(__ptr + 2) = 0;
  uVar12 = p->nObjs;
  if (1 < (int)uVar12) {
    lVar14 = 1;
    lVar16 = 0xc;
    do {
      uVar13 = *(ulong *)(&p->pObjs->field_0x0 + lVar16);
      uVar12 = (uint)uVar13;
      if ((uVar13 & 0x1fffffff) == 0x1fffffff || (int)uVar12 < 0) {
        if ((int)uVar12 < 0 && (int)(uVar13 & 0x1fffffff) != 0x1fffffff) {
          uVar13 = (ulong)-(uVar12 & 0x1fffffff) + lVar14;
          iVar3 = (int)uVar13;
          if ((-1 < iVar3) && (uVar12 = __ptr[1], iVar3 < (int)uVar12)) {
            pvVar4 = *(void **)(__ptr + 2);
            cVar11 = *(char *)((long)pvVar4 + (uVar13 & 0xffffffff));
            goto LAB_002f44e1;
          }
          goto LAB_002f471a;
        }
        if ((~uVar12 & 0x9fffffff) != 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                        ,0xe7,"Vec_Str_t *Lms_GiaSuppSizes(Gia_Man_t *)");
        }
        if (-1 < (int)uVar12) {
          __assert_fail("pObj->fTerm",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1da,"int Gia_ObjCioId(Gia_Obj_t *)");
        }
        cVar11 = (char)(uVar13 >> 0x20) + '\x01';
        uVar10 = *__ptr;
        uVar12 = __ptr[1];
        if (uVar12 == uVar10) {
          if (0xf < (int)uVar10) {
            sVar15 = (ulong)uVar10 * 2;
            if ((int)sVar15 <= (int)uVar10) goto LAB_002f4592;
            pvVar4 = *(void **)(__ptr + 2);
            goto LAB_002f4569;
          }
          pvVar4 = *(void **)(__ptr + 2);
          goto LAB_002f4537;
        }
      }
      else {
        uVar5 = (ulong)-(uVar12 & 0x1fffffff) + lVar14;
        iVar3 = (int)uVar5;
        if ((iVar3 < 0) || (uVar12 = __ptr[1], (int)uVar12 <= iVar3)) goto LAB_002f471a;
        uVar13 = (ulong)-((uint)(uVar13 >> 0x20) & 0x1fffffff) + lVar14;
        iVar3 = (int)uVar13;
        if ((iVar3 < 0) || ((int)uVar12 <= iVar3)) goto LAB_002f471a;
        pvVar4 = *(void **)(__ptr + 2);
        cVar1 = *(char *)((long)pvVar4 + (uVar5 & 0xffffffff));
        cVar11 = *(char *)((long)pvVar4 + (uVar13 & 0xffffffff));
        if (cVar11 < cVar1) {
          cVar11 = cVar1;
        }
LAB_002f44e1:
        uVar10 = *__ptr;
        if (uVar12 == uVar10) {
          if ((int)uVar10 < 0x10) {
LAB_002f4537:
            if (pvVar4 == (void *)0x0) {
              pvVar4 = malloc(0x10);
            }
            else {
              pvVar4 = realloc(pvVar4,0x10);
            }
            sVar15 = 0x10;
          }
          else {
            sVar15 = (ulong)uVar10 * 2;
            if ((int)sVar15 <= (int)uVar10) goto LAB_002f4592;
LAB_002f4569:
            if (pvVar4 == (void *)0x0) {
              pvVar4 = malloc(sVar15);
            }
            else {
              pvVar4 = realloc(pvVar4,sVar15);
            }
          }
          *(void **)(__ptr + 2) = pvVar4;
          *__ptr = (uint)sVar15;
        }
      }
LAB_002f4592:
      __ptr[1] = uVar12 + 1;
      *(char *)(*(long *)(__ptr + 2) + (long)(int)uVar12) = cVar11;
      lVar14 = lVar14 + 1;
      uVar12 = p->nObjs;
      lVar16 = lVar16 + 0xc;
    } while (lVar14 < (int)uVar12);
  }
  uVar10 = __ptr[1];
  if (uVar10 != uVar12) {
    __assert_fail("Vec_StrSize(vSupps) == Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                  ,0xe9,"Vec_Str_t *Lms_GiaSuppSizes(Gia_Man_t *)");
  }
  iVar3 = p->vCos->nSize;
  pVVar6 = (Vec_Str_t *)malloc(0x10);
  iVar9 = 0x10;
  if (0xe < iVar3 - 1U) {
    iVar9 = iVar3;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = iVar9;
  if (iVar9 == 0) {
    pcVar7 = (char *)0x0;
  }
  else {
    pcVar7 = (char *)malloc((long)iVar9);
  }
  pVVar6->pArray = pcVar7;
  pVVar8 = p->vCos;
  if (0 < pVVar8->nSize) {
    lVar14 = 0;
    do {
      iVar3 = pVVar8->pArray[lVar14];
      if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if ((int)uVar10 <= iVar3) {
LAB_002f471a:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      cVar11 = *(char *)(*(long *)(__ptr + 2) + (long)iVar3);
      uVar12 = pVVar6->nSize;
      uVar2 = pVVar6->nCap;
      if (uVar12 == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (pVVar6->pArray == (char *)0x0) {
            pcVar7 = (char *)malloc(0x10);
          }
          else {
            pcVar7 = (char *)realloc(pVVar6->pArray,0x10);
          }
          sVar15 = 0x10;
        }
        else {
          sVar15 = (ulong)uVar2 * 2;
          if ((int)sVar15 <= (int)uVar2) goto LAB_002f46bb;
          if (pVVar6->pArray == (char *)0x0) {
            pcVar7 = (char *)malloc(sVar15);
          }
          else {
            pcVar7 = (char *)realloc(pVVar6->pArray,sVar15);
          }
        }
        pVVar6->pArray = pcVar7;
        pVVar6->nCap = (int)sVar15;
      }
LAB_002f46bb:
      pVVar6->nSize = uVar12 + 1;
      pVVar6->pArray[(int)uVar12] = cVar11;
      lVar14 = lVar14 + 1;
      pVVar8 = p->vCos;
    } while (lVar14 < pVVar8->nSize);
  }
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  free(__ptr);
  return pVVar6;
}

Assistant:

Vec_Str_t * Lms_GiaSuppSizes( Gia_Man_t * p )
{
    Vec_Str_t * vResult;
    Vec_Str_t * vSupps;
    Gia_Obj_t * pObj;
    int i;
    vSupps = Vec_StrAlloc( Gia_ManObjNum(p) );
    Vec_StrPush( vSupps, 0 );
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            Vec_StrPush( vSupps, (char)Abc_MaxInt( Vec_StrEntry(vSupps, Gia_ObjFaninId0(pObj, i)), Vec_StrEntry(vSupps, Gia_ObjFaninId1(pObj, i)) ) );
        else if ( Gia_ObjIsCo(pObj) )
            Vec_StrPush( vSupps, Vec_StrEntry(vSupps, Gia_ObjFaninId0(pObj, i)) );
        else if ( Gia_ObjIsCi(pObj) )
            Vec_StrPush( vSupps, (char)(Gia_ObjCioId(pObj)+1) );
        else assert( 0 );
    }
    assert( Vec_StrSize(vSupps) == Gia_ManObjNum(p) );
    vResult = Vec_StrAlloc( Gia_ManCoNum(p) );
    Gia_ManForEachCo( p, pObj, i )
        Vec_StrPush( vResult, Vec_StrEntry(vSupps, Gia_ObjId(p, pObj)) );
    Vec_StrFree( vSupps );
    return vResult;
}